

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O0

bool __thiscall llvm::yaml::isNumeric(yaml *this,StringRef S)

{
  StringRef Input;
  StringRef Input_00;
  StringRef Input_01;
  bool bVar1;
  char cVar2;
  size_type sVar3;
  size_t sVar4;
  char *pcVar5;
  bool local_1fa;
  bool local_1f9;
  StringRef local_1e8;
  StringRef local_1d8;
  StringRef local_1c8;
  char *local_1b8;
  char *local_1b0;
  StringRef local_1a8;
  StringRef local_198;
  StringRef local_188;
  char *local_178;
  char *local_170;
  StringRef local_168;
  int local_154;
  undefined1 auStack_150 [4];
  ParseState State;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  undefined1 local_80 [8];
  StringRef Tail;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  StringRef local_30;
  undefined1 local_20 [8];
  StringRef S_local;
  
  S_local.Data = S.Data;
  local_20 = (undefined1  [8])this;
  bVar1 = StringRef::empty((StringRef *)local_20);
  if (!bVar1) {
    StringRef::StringRef(&local_30,"+");
    bVar1 = StringRef::equals((StringRef *)local_20,local_30);
    if (!bVar1) {
      StringRef::StringRef(&local_40,"-");
      bVar1 = StringRef::equals((StringRef *)local_20,local_40);
      if (!bVar1) {
        StringRef::StringRef(&local_50,".nan");
        bVar1 = StringRef::equals((StringRef *)local_20,local_50);
        if (!bVar1) {
          StringRef::StringRef(&local_60,".NaN");
          bVar1 = StringRef::equals((StringRef *)local_20,local_60);
          if (!bVar1) {
            StringRef::StringRef((StringRef *)&Tail.Length,".NAN");
            bVar1 = StringRef::equals((StringRef *)local_20,stack0xffffffffffffff90);
            if (!bVar1) {
              cVar2 = StringRef::front((StringRef *)local_20);
              if ((cVar2 == '-') || (cVar2 = StringRef::front((StringRef *)local_20), cVar2 == '+'))
              {
                _local_80 = StringRef::drop_front((StringRef *)local_20,1);
              }
              else {
                Tail.Data = S_local.Data;
                local_80 = local_20;
              }
              StringRef::StringRef(&local_90,".inf");
              bVar1 = StringRef::equals((StringRef *)local_80,local_90);
              if (!bVar1) {
                StringRef::StringRef(&local_a0,".Inf");
                bVar1 = StringRef::equals((StringRef *)local_80,local_a0);
                if (!bVar1) {
                  StringRef::StringRef(&local_b0,".INF");
                  bVar1 = StringRef::equals((StringRef *)local_80,local_b0);
                  if (!bVar1) {
                    StringRef::StringRef(&local_c0,"0o");
                    bVar1 = StringRef::startswith((StringRef *)local_20,local_c0);
                    if (bVar1) {
                      sVar4 = StringRef::size((StringRef *)local_20);
                      local_1f9 = false;
                      if (2 < sVar4) {
                        local_d0 = StringRef::drop_front((StringRef *)local_20,2);
                        StringRef::StringRef(&local_e0,"01234567");
                        sVar3 = StringRef::find_first_not_of(&local_d0,local_e0,0);
                        local_1f9 = sVar3 == 0xffffffffffffffff;
                      }
                      return local_1f9;
                    }
                    StringRef::StringRef(&local_f0,"0x");
                    bVar1 = StringRef::startswith((StringRef *)local_20,local_f0);
                    if (bVar1) {
                      sVar4 = StringRef::size((StringRef *)local_20);
                      local_1fa = false;
                      if (2 < sVar4) {
                        local_100 = StringRef::drop_front((StringRef *)local_20,2);
                        StringRef::StringRef(&local_110,"0123456789abcdefABCDEF");
                        sVar3 = StringRef::find_first_not_of(&local_100,local_110,0);
                        local_1fa = sVar3 == 0xffffffffffffffff;
                      }
                      return local_1fa;
                    }
                    local_20 = local_80;
                    S_local.Data = Tail.Data;
                    StringRef::StringRef(&local_120,".");
                    bVar1 = StringRef::startswith((StringRef *)local_20,local_120);
                    if (bVar1) {
                      StringRef::StringRef(&local_130,".");
                      bVar1 = StringRef::equals((StringRef *)local_20,local_130);
                      if (bVar1) {
                        return false;
                      }
                      sVar4 = StringRef::size((StringRef *)local_20);
                      if (1 < sVar4) {
                        cVar2 = StringRef::operator[]((StringRef *)local_20,1);
                        pcVar5 = strchr("0123456789",(int)cVar2);
                        if (pcVar5 == (char *)0x0) {
                          return false;
                        }
                      }
                    }
                    StringRef::StringRef(&local_140,"E");
                    bVar1 = StringRef::startswith((StringRef *)local_20,local_140);
                    if (!bVar1) {
                      StringRef::StringRef((StringRef *)auStack_150,"e");
                      bVar1 = StringRef::startswith((StringRef *)local_20,_auStack_150);
                      if (!bVar1) {
                        local_154 = 0;
                        local_178 = (char *)local_20;
                        local_170 = S_local.Data;
                        Input_01.Length = (size_t)S_local.Data;
                        Input_01.Data = (char *)local_20;
                        local_168 = isNumeric::anon_class_1_0_00000001::operator()
                                              ((anon_class_1_0_00000001 *)
                                               &isNumeric(llvm::StringRef)::skipDigits,Input_01);
                        local_20 = (undefined1  [8])local_168.Data;
                        S_local.Data = (char *)local_168.Length;
                        bVar1 = StringRef::empty((StringRef *)local_20);
                        if (bVar1) {
                          return true;
                        }
                        cVar2 = StringRef::front((StringRef *)local_20);
                        if (cVar2 == '.') {
                          local_154 = 1;
                          local_188 = StringRef::drop_front((StringRef *)local_20,1);
                          local_20 = (undefined1  [8])local_188.Data;
                          S_local.Data = (char *)local_188.Length;
                        }
                        else {
                          cVar2 = StringRef::front((StringRef *)local_20);
                          if ((cVar2 != 'e') &&
                             (cVar2 = StringRef::front((StringRef *)local_20), cVar2 != 'E')) {
                            return false;
                          }
                          local_154 = 2;
                          local_198 = StringRef::drop_front((StringRef *)local_20,1);
                          local_20 = (undefined1  [8])local_198.Data;
                          S_local.Data = (char *)local_198.Length;
                        }
                        if (local_154 == 1) {
                          local_1b8 = (char *)local_20;
                          local_1b0 = S_local.Data;
                          Input_00.Length = (size_t)S_local.Data;
                          Input_00.Data = (char *)local_20;
                          local_1a8 = isNumeric::anon_class_1_0_00000001::operator()
                                                ((anon_class_1_0_00000001 *)
                                                 &isNumeric(llvm::StringRef)::skipDigits,Input_00);
                          local_20 = (undefined1  [8])local_1a8.Data;
                          S_local.Data = (char *)local_1a8.Length;
                          bVar1 = StringRef::empty((StringRef *)local_20);
                          if (bVar1) {
                            return true;
                          }
                          cVar2 = StringRef::front((StringRef *)local_20);
                          if ((cVar2 != 'e') &&
                             (cVar2 = StringRef::front((StringRef *)local_20), cVar2 != 'E')) {
                            return false;
                          }
                          local_154 = 2;
                          local_1c8 = StringRef::drop_front((StringRef *)local_20,1);
                          local_20 = (undefined1  [8])local_1c8.Data;
                          S_local.Data = (char *)local_1c8.Length;
                        }
                        if (local_154 != 2) {
                          __assert_fail("State == FoundExponent && \"Should have found exponent at this point.\""
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/YAMLTraits.h"
                                        ,0x26d,"bool llvm::yaml::isNumeric(StringRef)");
                        }
                        bVar1 = StringRef::empty((StringRef *)local_20);
                        if (bVar1) {
                          return false;
                        }
                        cVar2 = StringRef::front((StringRef *)local_20);
                        if ((cVar2 == '+') ||
                           (cVar2 = StringRef::front((StringRef *)local_20), cVar2 == '-')) {
                          local_1d8 = StringRef::drop_front((StringRef *)local_20,1);
                          local_20 = (undefined1  [8])local_1d8.Data;
                          S_local.Data = (char *)local_1d8.Length;
                          bVar1 = StringRef::empty((StringRef *)local_20);
                          if (bVar1) {
                            return false;
                          }
                        }
                        Input.Length = (size_t)S_local.Data;
                        Input.Data = (char *)local_20;
                        local_1e8 = isNumeric::anon_class_1_0_00000001::operator()
                                              ((anon_class_1_0_00000001 *)
                                               &isNumeric(llvm::StringRef)::skipDigits,Input);
                        bVar1 = StringRef::empty(&local_1e8);
                        return bVar1;
                      }
                    }
                    return false;
                  }
                }
              }
              return true;
            }
          }
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

inline bool isNumeric(StringRef S) {
  const static auto skipDigits = [](StringRef Input) {
    return Input.drop_front(
        std::min(Input.find_first_not_of("0123456789"), Input.size()));
  };

  // Make S.front() and S.drop_front().front() (if S.front() is [+-]) calls
  // safe.
  if (S.empty() || S.equals("+") || S.equals("-"))
    return false;

  if (S.equals(".nan") || S.equals(".NaN") || S.equals(".NAN"))
    return true;

  // Infinity and decimal numbers can be prefixed with sign.
  StringRef Tail = (S.front() == '-' || S.front() == '+') ? S.drop_front() : S;

  // Check for infinity first, because checking for hex and oct numbers is more
  // expensive.
  if (Tail.equals(".inf") || Tail.equals(".Inf") || Tail.equals(".INF"))
    return true;

  // Section 10.3.2 Tag Resolution
  // YAML 1.2 Specification prohibits Base 8 and Base 16 numbers prefixed with
  // [-+], so S should be used instead of Tail.
  if (S.startswith("0o"))
    return S.size() > 2 &&
           S.drop_front(2).find_first_not_of("01234567") == StringRef::npos;

  if (S.startswith("0x"))
    return S.size() > 2 && S.drop_front(2).find_first_not_of(
                               "0123456789abcdefABCDEF") == StringRef::npos;

  // Parse float: [-+]? (\. [0-9]+ | [0-9]+ (\. [0-9]* )?) ([eE] [-+]? [0-9]+)?
  S = Tail;

  // Handle cases when the number starts with '.' and hence needs at least one
  // digit after dot (as opposed by number which has digits before the dot), but
  // doesn't have one.
  if (S.startswith(".") &&
      (S.equals(".") ||
       (S.size() > 1 && std::strchr("0123456789", S[1]) == nullptr)))
    return false;

  if (S.startswith("E") || S.startswith("e"))
    return false;

  enum ParseState {
    Default,
    FoundDot,
    FoundExponent,
  };
  ParseState State = Default;

  S = skipDigits(S);

  // Accept decimal integer.
  if (S.empty())
    return true;

  if (S.front() == '.') {
    State = FoundDot;
    S = S.drop_front();
  } else if (S.front() == 'e' || S.front() == 'E') {
    State = FoundExponent;
    S = S.drop_front();
  } else {
    return false;
  }

  if (State == FoundDot) {
    S = skipDigits(S);
    if (S.empty())
      return true;

    if (S.front() == 'e' || S.front() == 'E') {
      State = FoundExponent;
      S = S.drop_front();
    } else {
      return false;
    }
  }

  assert(State == FoundExponent && "Should have found exponent at this point.");
  if (S.empty())
    return false;

  if (S.front() == '+' || S.front() == '-') {
    S = S.drop_front();
    if (S.empty())
      return false;
  }

  return skipDigits(S).empty();
}